

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottie2gif.cpp
# Opt level: O2

bool __thiscall App::jsonFile(App *this)

{
  bool bVar1;
  string extn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&extn,".json",(allocator *)&local_30);
  if (extn._M_string_length < (this->fileName)._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)&this->fileName);
    bVar1 = std::operator!=(&local_30,&extn);
    std::__cxx11::string::~string((string *)&local_30);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&extn);
  return bVar1;
}

Assistant:

bool jsonFile() {
        std::string extn = ".json";
        if ( fileName.size() <= extn.size() ||
             fileName.substr(fileName.size()- extn.size()) != extn )
            return false;

        return true;
    }